

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wi_stuff.cpp
# Opt level: O2

void WI_Start(wbstartstruct_t *wbstartstruct)

{
  noautostartmap = 0;
  V_SetBlend(0,0,0,0);
  bcnt = 0;
  acceleratestage = 0;
  cnt = 0;
  me = wbstartstruct->pnum;
  plrs = wbstartstruct->plyr;
  wbs = wbstartstruct;
  WI_loadData();
  if (deathmatch.Value == 0) {
    if (multiplayer == true) {
      WI_initNetgameStats();
    }
    else {
      WI_initStats();
    }
  }
  else {
    WI_initDeathmatchStats();
  }
  S_StopAllChannels();
  SN_StopAllSequences();
  return;
}

Assistant:

void WI_Start (wbstartstruct_t *wbstartstruct)
{
	noautostartmap = false;
	V_SetBlend (0,0,0,0);
	WI_initVariables (wbstartstruct);
	WI_loadData ();
	if (deathmatch)
		WI_initDeathmatchStats();
	else if (multiplayer)
		WI_initNetgameStats();
	else
		WI_initStats();
	S_StopAllChannels ();
	SN_StopAllSequences ();
}